

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  App *pAVar2;
  App *pAVar3;
  Option *pOVar4;
  runtime_error *e_2;
  runtime_error *e_1;
  ParseError *e;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_8b8;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  Validator local_7d0;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  Validator local_6f0;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  Validator local_5c0;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  App *local_3f8;
  App *match_sub;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  App *local_3a0;
  App *generate_sub;
  string local_390;
  allocator<char> local_359;
  string local_358;
  undefined1 local_338 [8];
  App args;
  char **argv_local;
  int argc_local;
  
  args.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  spdlog::set_level(debug);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"Simple image matching utility.",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"",(allocator<char> *)((long)&generate_sub + 7));
  CLI::App::App((App *)local_338,&local_358,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)((long)&generate_sub + 7));
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  CLI::App::require_subcommand((App *)local_338,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"generate",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"Generate descriptor database.",
             (allocator<char> *)((long)&match_sub + 7));
  pAVar2 = CLI::App::add_subcommand((App *)local_338,&local_3c0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&match_sub + 7));
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  local_3a0 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"match",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Match an image against database.",&local_441);
  pAVar3 = CLI::App::add_subcommand((App *)local_338,&local_418,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  pAVar2 = local_3a0;
  local_3f8 = pAVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"type",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"Type of descriptor to generate (32, 64, 128 or 256)",&local_491);
  pOVar4 = CLI::App::add_option<unsigned_int,_unsigned_int,_(CLI::detail::enabler)0>
                     (pAVar2,&local_468,&app.type,&local_490,false);
  pOVar4 = CLI::OptionBase<CLI::Option>::required(&pOVar4->super_OptionBase<CLI::Option>,true);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_4b8,check_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
  CLI::Option::check(pOVar4,&local_4b8,&local_4d8,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4b8);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  pAVar2 = local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"dataset",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"Path to the directory containing images.",&local_551);
  pOVar4 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (pAVar2,&local_528,&app.dataset,&local_550,false);
  pOVar4 = CLI::OptionBase<CLI::Option>::required(&pOVar4->super_OptionBase<CLI::Option>,true);
  CLI::Validator::Validator(&local_5c0,(Validator *)CLI::ExistingDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"",&local_5e1);
  CLI::Option::check(pOVar4,&local_5c0,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  CLI::Validator::~Validator(&local_5c0);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  pAVar2 = local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"-f,--force-regenerate",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"Force regenerate all descriptors.",&local_631);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar2,&local_608,&app.force_regenerate,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  pAVar2 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"image_path",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"Path of image to compare.",&local_681);
  pOVar4 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (pAVar2,&local_658,&app.input_image_path,&local_680,false);
  pOVar4 = CLI::OptionBase<CLI::Option>::required(&pOVar4->super_OptionBase<CLI::Option>,true);
  CLI::Validator::Validator(&local_6f0,(Validator *)CLI::ExistingFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"",&local_711);
  CLI::Option::check(pOVar4,&local_6f0,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  CLI::Validator::~Validator(&local_6f0);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  pAVar2 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"dataset",&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"Path to the directory containing images.",&local_761);
  pOVar4 = CLI::App::
           add_option<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_(CLI::detail::enabler)0>
                     (pAVar2,&local_738,&app.dataset,&local_760,false);
  pOVar4 = CLI::OptionBase<CLI::Option>::required(&pOVar4->super_OptionBase<CLI::Option>,true);
  CLI::Validator::Validator(&local_7d0,(Validator *)CLI::ExistingDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"",&local_7f1);
  CLI::Option::check(pOVar4,&local_7d0,&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  CLI::Validator::~Validator(&local_7d0);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  pAVar2 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"-n,--number-of-matches",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"Number of matches to display, -1 for all. (default: 10)",
             &local_841);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar2,&local_818,&app.matches_num,&local_840,false);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  pAVar2 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"-t,--type",&local_869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,"Type of descriptor to generate (32, 64, 128 or 256)",&local_891);
  pOVar4 = CLI::App::add_option<unsigned_int,_unsigned_int,_(CLI::detail::enabler)0>
                     (pAVar2,&local_868,&app.type,&local_890,false);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_8b8,check_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"",&local_901);
  CLI::Option::check(pOVar4,&local_8b8,&local_8d8,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8b8);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  std::__cxx11::string::~string((string *)&local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  pAVar2 = local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"-q,--quiet",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"Enable quiet mode.",&local_951);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar2,&local_928,&app.quiet_mode,&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  pAVar2 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"-q,--quiet",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"Enable quiet mode.",(allocator<char> *)((long)&e + 7));
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar2,&local_978,&app.quiet_mode,&local_9a0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  CLI::App::parse((App *)local_338,argc,
                  (char **)args.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  if ((app.quiet_mode & 1U) != 0) {
    spdlog::set_level(critical);
  }
  bVar1 = CLI::App::operator_cast_to_bool(local_3a0);
  if (bVar1) {
    run_generate_subcommand();
  }
  bVar1 = CLI::App::operator_cast_to_bool(local_3f8);
  if (bVar1) {
    run_match_subcommand();
  }
  CLI::App::~App((App *)local_338);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    // Set the default global log level to debug
    spdlog::set_level(spdlog::level::debug);

    // Parse command line arguments
    CLI::App args("Simple image matching utility.");
    args.require_subcommand(1);

    auto generate_sub =
      args.add_subcommand("generate", "Generate descriptor database.");
    auto match_sub =
      args.add_subcommand("match", "Match an image against database.");

    // Arguments for the generate subcommand
    generate_sub
      ->add_option(
        "type", app.type, "Type of descriptor to generate (32, 64, 128 or 256)")
      ->required(true)
      ->check(check_type);

    generate_sub
      ->add_option(
        "dataset", app.dataset, "Path to the directory containing images.")
      ->required()
      ->check(CLI::ExistingDirectory);

    generate_sub->add_flag("-f,--force-regenerate",
                           app.force_regenerate,
                           "Force regenerate all descriptors.");

    // Arguments for the match subcommand
    match_sub
      ->add_option(
        "image_path", app.input_image_path, "Path of image to compare.")
      ->required()
      ->check(CLI::ExistingFile);

    match_sub
      ->add_option(
        "dataset", app.dataset, "Path to the directory containing images.")
      ->required()
      ->check(CLI::ExistingDirectory);

    match_sub->add_option(
      "-n,--number-of-matches",
      app.matches_num,
      "Number of matches to display, -1 for all. (default: 10)");

    match_sub
      ->add_option("-t,--type",
                   app.type,
                   "Type of descriptor to generate (32, 64, 128 or 256)")
      ->check(check_type);

    // Common arguments for both commands
    generate_sub->add_flag("-q,--quiet", app.quiet_mode, "Enable quiet mode.");
    match_sub->add_flag("-q,--quiet", app.quiet_mode, "Enable quiet mode.");

    CLI11_PARSE(args, argc, argv);

    if (app.quiet_mode)
        spdlog::set_level(spdlog::level::critical);

    if (*generate_sub)
        try {
            run_generate_subcommand();
        } catch (std::runtime_error& e) {
            spdlog::critical(e.what());
            return EXIT_FAILURE;
        }

    if (*match_sub)
        try {
            run_match_subcommand();
        } catch (std::runtime_error& e) {
            spdlog::critical(e.what());
            return EXIT_FAILURE;
        }

    return EXIT_SUCCESS;
}